

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::DefineDirectiveSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,DefineDirectiveSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_60;
  size_t index_local;
  DefineDirectiveSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->super_DirectiveSyntax).directive.kind;
    token._2_1_ = (this->super_DirectiveSyntax).directive.field_0x2;
    token.numFlags.raw = (this->super_DirectiveSyntax).directive.numFlags.raw;
    token.rawLen = (this->super_DirectiveSyntax).directive.rawLen;
    token.info = (this->super_DirectiveSyntax).directive.info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->formalArguments->super_SyntaxNode);
    break;
  case 3:
    local_60 = (SyntaxNode *)0x0;
    if (this != (DefineDirectiveSyntax *)0xffffffffffffffc8) {
      local_60 = &(this->body).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax DefineDirectiveSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return directive;
        case 1: return name;
        case 2: return formalArguments;
        case 3: return &body;
        default: return nullptr;
    }
}